

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgn_parser.c
# Opt level: O3

int yyparse(void)

{
  char cVar1;
  uint uVar2;
  yytype_int8 yVar3;
  uint uVar4;
  char *pcVar5;
  int *piVar6;
  size_t sVar7;
  int iVar8;
  long lVar9;
  yytype_int8 *pyVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  void *pvVar15;
  uint *puVar16;
  ulong uVar17;
  uint *__dest;
  long lVar18;
  char *pcVar19;
  uint uVar20;
  yy_state_t yyssa [200];
  YYSTYPE yyvsa [200];
  uint local_768;
  uint *local_750;
  char local_748 [208];
  uint local_678 [402];
  
  yychar = -2;
  iVar11 = 0;
  lVar13 = 200;
  pcVar14 = local_748;
  puVar16 = local_678;
  pcVar19 = pcVar14;
  local_750 = puVar16;
  do {
    *pcVar14 = (char)iVar11;
    pcVar5 = pcVar19;
    if (pcVar19 + lVar13 + -1 <= pcVar14) {
      if (lVar13 < 10000) {
        lVar13 = lVar13 * 2;
        if (9999 < lVar13) {
          lVar13 = 10000;
        }
        pcVar5 = (char *)malloc(lVar13 * 9 + 7);
        if (pcVar5 != (char *)0x0) {
          sVar7 = ((long)pcVar14 - (long)pcVar19) + 1;
          memcpy(pcVar5,pcVar19,sVar7);
          uVar17 = lVar13 + 0xe;
          if (-1 < (long)(lVar13 + 7U)) {
            uVar17 = lVar13 + 7U;
          }
          __dest = (uint *)(pcVar5 + (uVar17 & 0xfffffffffffffff8));
          memcpy(__dest,local_750,sVar7 * 8);
          if (pcVar19 != local_748) {
            free(pcVar19);
          }
          if ((long)sVar7 < lVar13) {
            pcVar14 = pcVar5 + ((long)pcVar14 - (long)pcVar19);
            puVar16 = __dest + sVar7 * 2 + -2;
            local_750 = __dest;
            goto LAB_00102895;
          }
          iVar11 = 1;
          goto LAB_0010341c;
        }
      }
      yyerror("memory exhausted");
      iVar11 = 2;
      goto LAB_0010340f;
    }
LAB_00102895:
    pcVar19 = pcVar5;
    if (iVar11 == 0x2d) {
      iVar11 = 0;
      goto LAB_0010340f;
    }
    cVar1 = yypact[iVar11];
    if (cVar1 != -0x49) {
      if (yychar == -2) {
        yychar = yylex();
      }
      if (yychar < 1) {
        yychar = 0;
        iVar8 = 0;
      }
      else {
        if (yychar == 0x100) {
          yychar = 0x101;
          iVar11 = 1;
LAB_0010340f:
          pcVar5 = pcVar19;
          if (pcVar19 != local_748) {
LAB_0010341c:
            free(pcVar5);
          }
          return iVar11;
        }
        iVar8 = 2;
        if ((uint)yychar < 0x117) {
          iVar8 = (int)""[(uint)yychar];
        }
      }
      uVar20 = cVar1 + iVar8;
      if ((0x53 < uVar20) ||
         (iVar8 != "H\x04\x05\x06\a\b\t\n\x18\f\r\x18\x0f\x10\x11\x12\x18YZ\x13\x14\x15\x162345IJ\x18\x18\x18\x18\x18\x18\x18\x18\x18\x18"
                   [uVar20])) goto LAB_0010294d;
      yVar3 = "V\x01\x02\x03\x04\x05\x06\a \b\t!\n\v\f\r\"bcQRST@ABCWX#$%&\'()*+,-/0123456789:;<>?MNDPF]`aHIJKLY[dZeg\\hil.jk_f"
              [uVar20];
      *(YYSTYPE *)(puVar16 + 2) = yylval;
      yychar = -2;
      goto LAB_001032b7;
    }
LAB_0010294d:
    lVar18 = (long)"\x02"[iVar11];
    if (lVar18 == 0) {
      yynerrs = yynerrs + 1;
      yyerror("syntax error");
      iVar11 = 1;
      goto LAB_0010340f;
    }
    lVar12 = (long)""[lVar18];
    local_768 = puVar16[(1 - lVar12) * 2];
    uVar20 = puVar16[(1 - lVar12) * 2 + 1];
    switch("\x02"[iVar11]) {
    case '\x03':
      output_dgn();
      break;
    case '\n':
      init_dungeon();
      lVar9 = (long)n_dgns;
      strcpy(tmpdungeon[lVar9].name,*(char **)(puVar16 + -6));
      tmpdungeon[lVar9].boneschar = (char)puVar16[-4];
      tmpdungeon[lVar9].lev.base = couple_0;
      tmpdungeon[lVar9].lev.rand = couple_1;
      tmpdungeon[lVar9].chance = *puVar16;
      goto LAB_00102f78;
    case '\v':
    case '(':
    case ')':
    case '-':
      local_768 = 0;
      break;
    case '\f':
    case '.':
      local_768 = *puVar16;
      break;
    case '\x10':
      tmpdungeon[n_dgns].entry_lev = *puVar16;
      break;
    case '\x12':
      if (*puVar16 - 0x10 < 0xfffffff2) {
LAB_00103126:
        pcVar5 = "Illegal description - ignoring!";
        goto LAB_00103132;
      }
      tmpdungeon[n_dgns].flags = tmpdungeon[n_dgns].flags | *puVar16;
      break;
    case '\x13':
      uVar4 = *puVar16;
      if ((int)uVar4 < 0x10 && uVar4 != 0) goto LAB_0010310f;
      tmpdungeon[n_dgns].flags = tmpdungeon[n_dgns].flags | uVar4;
      break;
    case '\x14':
      strcpy(tmpdungeon[n_dgns].protoname,*(char **)puVar16);
      free(*(void **)puVar16);
      break;
    case '\x1a':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -6));
      tmplevel[lVar9].boneschar = (char)puVar16[-4];
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmpdungeon[n_dgns].levels = tmpdungeon[n_dgns].levels + 1;
LAB_00102f78:
      pvVar15 = *(void **)(puVar16 + -6);
LAB_00103099:
      free(pvVar15);
      break;
    case '\x1b':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -8));
      tmplevel[lVar9].boneschar = (char)puVar16[-6];
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].rndlevs = *puVar16;
      goto LAB_00102feb;
    case '\x1c':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -8));
      tmplevel[lVar9].boneschar = (char)puVar16[-6];
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].chance = *puVar16;
LAB_00102feb:
      tmpdungeon[n_dgns].levels = tmpdungeon[n_dgns].levels + 1;
      pvVar15 = *(void **)(puVar16 + -8);
      goto LAB_00103099;
    case '\x1d':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -10));
      tmplevel[lVar9].boneschar = (char)puVar16[-8];
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].chance = puVar16[-2];
      tmplevel[lVar9].rndlevs = *puVar16;
      tmpdungeon[n_dgns].levels = tmpdungeon[n_dgns].levels + 1;
      pvVar15 = *(void **)(puVar16 + -10);
      goto LAB_00103099;
    case '\x1e':
      uVar4 = *puVar16;
      if (0xf < (int)uVar4) goto LAB_00103126;
LAB_00103144:
      tmplevel[n_levs].flags = tmplevel[n_levs].flags | uVar4;
      break;
    case '\x1f':
      uVar4 = *puVar16;
      if (0xf < (int)uVar4 || uVar4 == 0) goto LAB_00103144;
LAB_0010310f:
      pcVar5 = "Illegal alignment - ignoring!";
LAB_00103132:
      yyerror(pcVar5);
      break;
    case ' ':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -8));
      tmplevel[lVar9].boneschar = (char)puVar16[-6];
      iVar11 = getchain(*(char **)(puVar16 + -4));
      lVar9 = (long)n_levs;
      tmplevel[lVar9].chain = iVar11;
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      iVar11 = check_level();
      piVar6 = &tmpdungeon[n_dgns].levels;
      if (iVar11 == 0) {
        piVar6 = &n_levs;
      }
      *piVar6 = *piVar6 + (uint)(iVar11 != 0) * 2 + -1;
      free(*(void **)(puVar16 + -8));
      pvVar15 = *(void **)(puVar16 + -4);
      goto LAB_00103235;
    case '!':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -10));
      tmplevel[lVar9].boneschar = (char)puVar16[-8];
      iVar11 = getchain(*(char **)(puVar16 + -6));
      lVar9 = (long)n_levs;
      tmplevel[lVar9].chain = iVar11;
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].rndlevs = *puVar16;
      goto LAB_001031ef;
    case '\"':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -10));
      tmplevel[lVar9].boneschar = (char)puVar16[-8];
      iVar11 = getchain(*(char **)(puVar16 + -6));
      lVar9 = (long)n_levs;
      tmplevel[lVar9].chain = iVar11;
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].chance = *puVar16;
LAB_001031ef:
      iVar11 = check_level();
      piVar6 = &tmpdungeon[n_dgns].levels;
      if (iVar11 == 0) {
        piVar6 = &n_levs;
      }
      *piVar6 = *piVar6 + (uint)(iVar11 != 0) * 2 + -1;
      free(*(void **)(puVar16 + -10));
      pvVar15 = *(void **)(puVar16 + -6);
LAB_00103235:
      free(pvVar15);
      break;
    case '#':
      init_level();
      lVar9 = (long)n_levs;
      strcpy(tmplevel[lVar9].name,*(char **)(puVar16 + -0xc));
      tmplevel[lVar9].boneschar = (char)puVar16[-10];
      iVar11 = getchain(*(char **)(puVar16 + -8));
      lVar9 = (long)n_levs;
      tmplevel[lVar9].chain = iVar11;
      tmplevel[lVar9].lev.base = couple_0;
      tmplevel[lVar9].lev.rand = couple_1;
      tmplevel[lVar9].chance = puVar16[-2];
      tmplevel[lVar9].rndlevs = *puVar16;
      iVar11 = check_level();
      piVar6 = &tmpdungeon[n_dgns].levels;
      if (iVar11 == 0) {
        piVar6 = &n_levs;
      }
      *piVar6 = *piVar6 + (uint)(iVar11 != 0) * 2 + -1;
      pvVar15 = *(void **)(puVar16 + -0xc);
      goto LAB_00102c88;
    case '&':
      init_branch();
      lVar9 = (long)n_brs;
      strcpy(tmpbranch[lVar9].name,*(char **)(puVar16 + -8));
      tmpbranch[lVar9].lev.base = couple_0;
      tmpbranch[lVar9].lev.rand = couple_1;
      tmpbranch[lVar9].type = puVar16[-2];
      tmpbranch[lVar9].up = *puVar16;
      iVar11 = check_branch();
      piVar6 = &tmpdungeon[n_dgns].branches;
      if (iVar11 == 0) {
        piVar6 = &n_brs;
      }
      *piVar6 = *piVar6 + (uint)(iVar11 != 0) * 2 + -1;
      goto LAB_00102d7c;
    case '\'':
      init_branch();
      strcpy(tmpbranch[n_brs].name,*(char **)(puVar16 + -10));
      iVar11 = getchain(*(char **)(puVar16 + -8));
      lVar9 = (long)n_brs;
      tmpbranch[lVar9].chain = iVar11;
      tmpbranch[lVar9].lev.base = couple_0;
      tmpbranch[lVar9].lev.rand = couple_1;
      tmpbranch[lVar9].type = puVar16[-2];
      tmpbranch[lVar9].up = *puVar16;
      iVar11 = check_branch();
      piVar6 = &tmpdungeon[n_dgns].branches;
      if (iVar11 == 0) {
        piVar6 = &n_brs;
      }
      *piVar6 = *piVar6 + (uint)(iVar11 != 0) * 2 + -1;
      pvVar15 = *(void **)(puVar16 + -10);
LAB_00102c88:
      free(pvVar15);
LAB_00102d7c:
      pvVar15 = *(void **)(puVar16 + -8);
      goto LAB_00103235;
    case '*':
      local_768 = 1;
      break;
    case '+':
      local_768 = 2;
      break;
    case ',':
      local_768 = 3;
      break;
    case '/':
      pcVar5 = *(char **)puVar16;
      sVar7 = strlen(pcVar5);
      if (sVar7 == 1) {
        local_768 = (uint)*pcVar5;
      }
      else {
        iVar11 = strcmp(pcVar5,"none");
        local_768 = 0;
        if (iVar11 != 0) {
          yyerror("Bones marker must be a single char, or \"none\"!");
        }
      }
      free(pcVar5);
      break;
    case '0':
      uVar4 = puVar16[-6];
      if (uVar4 - 0x21 < 0xffffffbf) {
        pcVar5 = "Abs base out of dlevel range - zeroing!";
      }
      else {
        uVar2 = puVar16[-2];
        if (-2 < (int)uVar2) {
          if ((int)uVar4 < 0) {
            if ((int)(uVar4 + uVar2 + 0x20) < 0x20) goto LAB_001033b3;
          }
          else if ((int)(uVar2 + uVar4) < 0x21) {
LAB_001033b3:
            couple_0 = (short)uVar4;
            couple_1 = (short)uVar2;
            break;
          }
        }
        pcVar5 = "Abs range out of dlevel range - zeroing!";
      }
LAB_00103323:
      yyerror(pcVar5);
      couple_1 = 0;
      couple_0 = 0;
      break;
    case '1':
      if (puVar16[-6] - 0x21 < 0xffffffbf) {
        pcVar5 = "Rel base out of dlevel range - zeroing!";
        goto LAB_00103323;
      }
      couple_0 = (short)puVar16[-6];
      couple_1 = (short)puVar16[-2];
    }
    puVar16 = puVar16 + lVar12 * -2;
    pcVar14 = pcVar14 + -lVar12;
    puVar16[2] = local_768;
    puVar16[3] = uVar20;
    uVar20 = (int)""[(long)""[lVar18] + 0x22] + (int)*pcVar14;
    if ((uVar20 < 0x54) &&
       ("H\x04\x05\x06\a\b\t\n\x18\f\r\x18\x0f\x10\x11\x12\x18YZ\x13\x14\x15\x162345IJ\x18\x18\x18\x18\x18\x18\x18\x18\x18\x18"
        [uVar20] == *pcVar14)) {
      pyVar10 = "V\x01\x02\x03\x04\x05\x06\a \b\t!\n\v\f\r\"bcQRST@ABCWX#$%&\'()*+,-/0123456789:;<>?MNDPF]`aHIJKLY[dZeg\\hil.jk_f"
                + uVar20;
    }
    else {
      pyVar10 = yypgoto + (long)""[lVar18] + 2;
    }
    yVar3 = *pyVar10;
LAB_001032b7:
    puVar16 = puVar16 + 2;
    iVar11 = (int)yVar3;
    pcVar14 = pcVar14 + 1;
  } while( true );
}

Assistant:

int
yyparse (void)
{
    yy_state_fast_t yystate = 0;
    /* Number of tokens to shift before error messages enabled.  */
    int yyerrstatus = 0;

    /* Refer to the stacks through separate pointers, to allow yyoverflow
       to reallocate them elsewhere.  */

    /* Their size.  */
    YYPTRDIFF_T yystacksize = YYINITDEPTH;

    /* The state stack: array, bottom, top.  */
    yy_state_t yyssa[YYINITDEPTH];
    yy_state_t *yyss = yyssa;
    yy_state_t *yyssp = yyss;

    /* The semantic value stack: array, bottom, top.  */
    YYSTYPE yyvsa[YYINITDEPTH];
    YYSTYPE *yyvs = yyvsa;
    YYSTYPE *yyvsp = yyvs;

  int yyn;
  /* The return value of yyparse.  */
  int yyresult;
  /* Lookahead symbol kind.  */
  yysymbol_kind_t yytoken = YYSYMBOL_YYEMPTY;
  /* The variables used to return semantic value and location from the
     action routines.  */
  YYSTYPE yyval;



#define YYPOPSTACK(N)   (yyvsp -= (N), yyssp -= (N))

  /* The number of symbols on the RHS of the reduced rule.
     Keep to zero when no symbol should be popped.  */
  int yylen = 0;

  YYDPRINTF ((stderr, "Starting parse\n"));

  yychar = YYEMPTY; /* Cause a token to be read.  */

  goto yysetstate;


/*------------------------------------------------------------.
| yynewstate -- push a new state, which is found in yystate.  |
`------------------------------------------------------------*/
yynewstate:
  /* In all cases, when you get here, the value and location stacks
     have just been pushed.  So pushing a state here evens the stacks.  */
  yyssp++;


/*--------------------------------------------------------------------.
| yysetstate -- set current state (the top of the stack) to yystate.  |
`--------------------------------------------------------------------*/
yysetstate:
  YYDPRINTF ((stderr, "Entering state %d\n", yystate));
  YY_ASSERT (0 <= yystate && yystate < YYNSTATES);
  YY_IGNORE_USELESS_CAST_BEGIN
  *yyssp = YY_CAST (yy_state_t, yystate);
  YY_IGNORE_USELESS_CAST_END
  YY_STACK_PRINT (yyss, yyssp);

  if (yyss + yystacksize - 1 <= yyssp)
#if !defined yyoverflow && !defined YYSTACK_RELOCATE
    YYNOMEM;
#else
    {
      /* Get the current used size of the three stacks, in elements.  */
      YYPTRDIFF_T yysize = yyssp - yyss + 1;

# if defined yyoverflow
      {
        /* Give user a chance to reallocate the stack.  Use copies of
           these so that the &'s don't force the real ones into
           memory.  */
        yy_state_t *yyss1 = yyss;
        YYSTYPE *yyvs1 = yyvs;

        /* Each stack pointer address is followed by the size of the
           data in use in that stack, in bytes.  This used to be a
           conditional around just the two extra args, but that might
           be undefined if yyoverflow is a macro.  */
        yyoverflow (YY_("memory exhausted"),
                    &yyss1, yysize * YYSIZEOF (*yyssp),
                    &yyvs1, yysize * YYSIZEOF (*yyvsp),
                    &yystacksize);
        yyss = yyss1;
        yyvs = yyvs1;
      }
# else /* defined YYSTACK_RELOCATE */
      /* Extend the stack our own way.  */
      if (YYMAXDEPTH <= yystacksize)
        YYNOMEM;
      yystacksize *= 2;
      if (YYMAXDEPTH < yystacksize)
        yystacksize = YYMAXDEPTH;

      {
        yy_state_t *yyss1 = yyss;
        union yyalloc *yyptr =
          YY_CAST (union yyalloc *,
                   YYSTACK_ALLOC (YY_CAST (YYSIZE_T, YYSTACK_BYTES (yystacksize))));
        if (! yyptr)
          YYNOMEM;
        YYSTACK_RELOCATE (yyss_alloc, yyss);
        YYSTACK_RELOCATE (yyvs_alloc, yyvs);
#  undef YYSTACK_RELOCATE
        if (yyss1 != yyssa)
          YYSTACK_FREE (yyss1);
      }
# endif

      yyssp = yyss + yysize - 1;
      yyvsp = yyvs + yysize - 1;

      YY_IGNORE_USELESS_CAST_BEGIN
      YYDPRINTF ((stderr, "Stack size increased to %ld\n",
                  YY_CAST (long, yystacksize)));
      YY_IGNORE_USELESS_CAST_END

      if (yyss + yystacksize - 1 <= yyssp)
        YYABORT;
    }
#endif /* !defined yyoverflow && !defined YYSTACK_RELOCATE */


  if (yystate == YYFINAL)
    YYACCEPT;

  goto yybackup;


/*-----------.
| yybackup.  |
`-----------*/
yybackup:
  /* Do appropriate processing given the current state.  Read a
     lookahead token if we need one and don't already have one.  */

  /* First try to decide what to do without reference to lookahead token.  */
  yyn = yypact[yystate];
  if (yypact_value_is_default (yyn))
    goto yydefault;

  /* Not known => get a lookahead token if don't already have one.  */

  /* YYCHAR is either empty, or end-of-input, or a valid lookahead.  */
  if (yychar == YYEMPTY)
    {
      YYDPRINTF ((stderr, "Reading a token\n"));
      yychar = yylex ();
    }

  if (yychar <= YYEOF)
    {
      yychar = YYEOF;
      yytoken = YYSYMBOL_YYEOF;
      YYDPRINTF ((stderr, "Now at end of input.\n"));
    }
  else if (yychar == YYerror)
    {
      /* The scanner already issued an error message, process directly
         to error recovery.  But do not keep the error token as
         lookahead, it is too special and may lead us to an endless
         loop in error recovery. */
      yychar = YYUNDEF;
      yytoken = YYSYMBOL_YYerror;
      goto yyerrlab1;
    }
  else
    {
      yytoken = YYTRANSLATE (yychar);
      YY_SYMBOL_PRINT ("Next token is", yytoken, &yylval, &yylloc);
    }

  /* If the proper action on seeing token YYTOKEN is to reduce or to
     detect an error, take that action.  */
  yyn += yytoken;
  if (yyn < 0 || YYLAST < yyn || yycheck[yyn] != yytoken)
    goto yydefault;
  yyn = yytable[yyn];
  if (yyn <= 0)
    {
      if (yytable_value_is_error (yyn))
        goto yyerrlab;
      yyn = -yyn;
      goto yyreduce;
    }

  /* Count tokens shifted since error; after three, turn off error
     status.  */
  if (yyerrstatus)
    yyerrstatus--;

  /* Shift the lookahead token.  */
  YY_SYMBOL_PRINT ("Shifting", yytoken, &yylval, &yylloc);
  yystate = yyn;
  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END

  /* Discard the shifted token.  */
  yychar = YYEMPTY;
  goto yynewstate;


/*-----------------------------------------------------------.
| yydefault -- do the default action for the current state.  |
`-----------------------------------------------------------*/
yydefault:
  yyn = yydefact[yystate];
  if (yyn == 0)
    goto yyerrlab;
  goto yyreduce;


/*-----------------------------.
| yyreduce -- do a reduction.  |
`-----------------------------*/
yyreduce:
  /* yyn is the number of a rule to reduce with.  */
  yylen = yyr2[yyn];

  /* If YYLEN is nonzero, implement the default value of the action:
     '$$ = $1'.

     Otherwise, the following line sets YYVAL to garbage.
     This behavior is undocumented and Bison
     users should not rely upon it.  Assigning to YYVAL
     unconditionally makes the parser a bit smaller, and it avoids a
     GCC warning that YYVAL may be used uninitialized.  */
  yyval = yyvsp[1-yylen];


  YY_REDUCE_PRINT (yyn);
  switch (yyn)
    {
  case 3: /* file: dungeons  */
#line 61 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			output_dgn();
		  }
#line 1215 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 10: /* dungeonline: A_DUNGEON ':' STRING bones_tag rcouple optional_int  */
#line 77 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_dungeon();
			strcpy(tmpdungeon[n_dgns].name, (yyvsp[-3].str));
			tmpdungeon[n_dgns].boneschar = (char)(yyvsp[-2].i);
			tmpdungeon[n_dgns].lev.base = couple.base;
			tmpdungeon[n_dgns].lev.rand = couple.rand;
			tmpdungeon[n_dgns].chance = (yyvsp[0].i);
			Free((yyvsp[-3].str));
		  }
#line 1229 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 11: /* optional_int: %empty  */
#line 89 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = 0;
		  }
#line 1237 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 12: /* optional_int: INTEGER  */
#line 93 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = (yyvsp[0].i);
		  }
#line 1245 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 16: /* entry: ENTRY ':' INTEGER  */
#line 104 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			tmpdungeon[n_dgns].entry_lev = (yyvsp[0].i);
		  }
#line 1253 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 18: /* desc: DESCRIPTION ':' DESCRIPTOR  */
#line 113 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if((yyvsp[0].i) <= TOWN || (yyvsp[0].i) >= D_ALIGN_CHAOTIC)
			    yyerror("Illegal description - ignoring!");
			else
			    tmpdungeon[n_dgns].flags |= (yyvsp[0].i) ;
		  }
#line 1264 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 19: /* desc: ALIGNMENT ':' DESCRIPTOR  */
#line 120 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if((yyvsp[0].i) && (yyvsp[0].i) < D_ALIGN_CHAOTIC)
			    yyerror("Illegal alignment - ignoring!");
			else
			    tmpdungeon[n_dgns].flags |= (yyvsp[0].i) ;
		  }
#line 1275 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 20: /* prototype: PROTOFILE ':' STRING  */
#line 129 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			strcpy(tmpdungeon[n_dgns].protoname, (yyvsp[0].str));
			Free((yyvsp[0].str));
		  }
#line 1284 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 26: /* level1: LEVEL ':' STRING bones_tag '@' acouple  */
#line 143 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-3].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-2].i);
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-3].str));
		  }
#line 1298 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 27: /* level1: RNDLEVEL ':' STRING bones_tag '@' acouple INTEGER  */
#line 153 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-4].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-3].i);
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].rndlevs = (yyvsp[0].i);
			tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-4].str));
		  }
#line 1313 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 28: /* level2: LEVEL ':' STRING bones_tag '@' acouple INTEGER  */
#line 166 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-4].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-3].i);
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].chance = (yyvsp[0].i);
			tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-4].str));
		  }
#line 1328 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 29: /* level2: RNDLEVEL ':' STRING bones_tag '@' acouple INTEGER INTEGER  */
#line 177 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-5].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-4].i);
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].chance = (yyvsp[-1].i);
			tmplevel[n_levs].rndlevs = (yyvsp[0].i);
			tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-5].str));
		  }
#line 1344 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 30: /* levdesc: LEVELDESC ':' DESCRIPTOR  */
#line 191 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if((yyvsp[0].i) >= D_ALIGN_CHAOTIC)
			    yyerror("Illegal description - ignoring!");
			else
			    tmplevel[n_levs].flags |= (yyvsp[0].i) ;
		  }
#line 1355 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 31: /* levdesc: LEVALIGN ':' DESCRIPTOR  */
#line 198 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if((yyvsp[0].i) && (yyvsp[0].i) < D_ALIGN_CHAOTIC)
			    yyerror("Illegal alignment - ignoring!");
			else
			    tmplevel[n_levs].flags |= (yyvsp[0].i) ;
		  }
#line 1366 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 32: /* chlevel1: CHLEVEL ':' STRING bones_tag STRING '+' rcouple  */
#line 207 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-4].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-3].i);
			tmplevel[n_levs].chain = getchain((yyvsp[-2].str));
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			if(!check_level()) n_levs--;
			else tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-4].str));
			Free((yyvsp[-2].str));
		  }
#line 1383 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 33: /* chlevel1: RNDCHLEVEL ':' STRING bones_tag STRING '+' rcouple INTEGER  */
#line 220 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-5].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-4].i);
			tmplevel[n_levs].chain = getchain((yyvsp[-3].str));
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].rndlevs = (yyvsp[0].i);
			if(!check_level()) n_levs--;
			else tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-5].str));
			Free((yyvsp[-3].str));
		  }
#line 1401 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 34: /* chlevel2: CHLEVEL ':' STRING bones_tag STRING '+' rcouple INTEGER  */
#line 236 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-5].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-4].i);
			tmplevel[n_levs].chain = getchain((yyvsp[-3].str));
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].chance = (yyvsp[0].i);
			if(!check_level()) n_levs--;
			else tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-5].str));
			Free((yyvsp[-3].str));
		  }
#line 1419 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 35: /* chlevel2: RNDCHLEVEL ':' STRING bones_tag STRING '+' rcouple INTEGER INTEGER  */
#line 250 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_level();
			strcpy(tmplevel[n_levs].name, (yyvsp[-6].str));
			tmplevel[n_levs].boneschar = (char)(yyvsp[-5].i);
			tmplevel[n_levs].chain = getchain((yyvsp[-4].str));
			tmplevel[n_levs].lev.base = couple.base;
			tmplevel[n_levs].lev.rand = couple.rand;
			tmplevel[n_levs].chance = (yyvsp[-1].i);
			tmplevel[n_levs].rndlevs = (yyvsp[0].i);
			if(!check_level()) n_levs--;
			else tmpdungeon[n_dgns].levels++;
			Free((yyvsp[-6].str));
			Free((yyvsp[-4].str));
		  }
#line 1438 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 38: /* branch: BRANCH ':' STRING '@' acouple branch_type direction  */
#line 271 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_branch();
			strcpy(tmpbranch[n_brs].name, (yyvsp[-4].str));
			tmpbranch[n_brs].lev.base = couple.base;
			tmpbranch[n_brs].lev.rand = couple.rand;
			tmpbranch[n_brs].type = (yyvsp[-1].i);
			tmpbranch[n_brs].up = (yyvsp[0].i);
			if(!check_branch()) n_brs--;
			else tmpdungeon[n_dgns].branches++;
			Free((yyvsp[-4].str));
		  }
#line 1454 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 39: /* chbranch: CHBRANCH ':' STRING STRING '+' rcouple branch_type direction  */
#line 285 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			init_branch();
			strcpy(tmpbranch[n_brs].name, (yyvsp[-5].str));
			tmpbranch[n_brs].chain = getchain((yyvsp[-4].str));
			tmpbranch[n_brs].lev.base = couple.base;
			tmpbranch[n_brs].lev.rand = couple.rand;
			tmpbranch[n_brs].type = (yyvsp[-1].i);
			tmpbranch[n_brs].up = (yyvsp[0].i);
			if(!check_branch()) n_brs--;
			else tmpdungeon[n_dgns].branches++;
			Free((yyvsp[-5].str));
			Free((yyvsp[-4].str));
		  }
#line 1472 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 40: /* branch_type: %empty  */
#line 301 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = TBR_STAIR;	/* two way stair */
		  }
#line 1480 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 41: /* branch_type: STAIR  */
#line 305 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = TBR_STAIR;	/* two way stair */
		  }
#line 1488 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 42: /* branch_type: NO_UP  */
#line 309 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = TBR_NO_UP;	/* no up staircase */
		  }
#line 1496 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 43: /* branch_type: NO_DOWN  */
#line 313 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = TBR_NO_DOWN;	/* no down staircase */
		  }
#line 1504 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 44: /* branch_type: PORTAL  */
#line 317 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = TBR_PORTAL;	/* portal connection */
		  }
#line 1512 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 45: /* direction: %empty  */
#line 323 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = 0;	/* defaults to down */
		  }
#line 1520 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 46: /* direction: UP_OR_DOWN  */
#line 327 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			(yyval.i) = (yyvsp[0].i);
		  }
#line 1528 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 47: /* bones_tag: STRING  */
#line 333 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			char *p = (yyvsp[0].str);
			if (strlen(p) != 1) {
			    if (strcmp(p, "none") != 0)
		   yyerror("Bones marker must be a single char, or \"none\"!");
			    *p = '\0';
			}
			(yyval.i) = *p;
			Free(p);
		  }
#line 1543 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 48: /* acouple: '(' INTEGER ',' INTEGER ')'  */
#line 363 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if ((yyvsp[-3].i) < -MAXLEVEL || (yyvsp[-3].i) > MAXLEVEL) {
			    yyerror("Abs base out of dlevel range - zeroing!");
			    couple.base = couple.rand = 0;
			} else if ((yyvsp[-1].i) < -1 ||
				(((yyvsp[-3].i) < 0) ? (MAXLEVEL + (yyvsp[-3].i) + (yyvsp[-1].i) + 1) > MAXLEVEL :
					((yyvsp[-3].i) + (yyvsp[-1].i)) > MAXLEVEL)) {
			    yyerror("Abs range out of dlevel range - zeroing!");
			    couple.base = couple.rand = 0;
			} else {
			    couple.base = (yyvsp[-3].i);
			    couple.rand = (yyvsp[-1].i);
			}
		  }
#line 1562 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;

  case 49: /* rcouple: '(' INTEGER ',' INTEGER ')'  */
#line 400 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/libdynamohack/util/dgn_comp.y"
                  {
			if ((yyvsp[-3].i) < -MAXLEVEL || (yyvsp[-3].i) > MAXLEVEL) {
			    yyerror("Rel base out of dlevel range - zeroing!");
			    couple.base = couple.rand = 0;
			} else {
			    couple.base = (yyvsp[-3].i);
			    couple.rand = (yyvsp[-1].i);
			}
		  }
#line 1576 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"
    break;


#line 1580 "/workspace/llm4binary/github/license_all_cmakelists_25/DynaMoHack[P]DynaMoHack/build_O3/libdynamohack/util/dgn_parser.c"

      default: break;
    }
  /* User semantic actions sometimes alter yychar, and that requires
     that yytoken be updated with the new translation.  We take the
     approach of translating immediately before every use of yytoken.
     One alternative is translating here after every semantic action,
     but that translation would be missed if the semantic action invokes
     YYABORT, YYACCEPT, or YYERROR immediately after altering yychar or
     if it invokes YYBACKUP.  In the case of YYABORT or YYACCEPT, an
     incorrect destructor might then be invoked immediately.  In the
     case of YYERROR or YYBACKUP, subsequent parser actions might lead
     to an incorrect destructor call or verbose syntax error message
     before the lookahead is translated.  */
  YY_SYMBOL_PRINT ("-> $$ =", YY_CAST (yysymbol_kind_t, yyr1[yyn]), &yyval, &yyloc);

  YYPOPSTACK (yylen);
  yylen = 0;

  *++yyvsp = yyval;

  /* Now 'shift' the result of the reduction.  Determine what state
     that goes to, based on the state we popped back to and the rule
     number reduced by.  */
  {
    const int yylhs = yyr1[yyn] - YYNTOKENS;
    const int yyi = yypgoto[yylhs] + *yyssp;
    yystate = (0 <= yyi && yyi <= YYLAST && yycheck[yyi] == *yyssp
               ? yytable[yyi]
               : yydefgoto[yylhs]);
  }

  goto yynewstate;


/*--------------------------------------.
| yyerrlab -- here on detecting error.  |
`--------------------------------------*/
yyerrlab:
  /* Make sure we have latest lookahead translation.  See comments at
     user semantic actions for why this is necessary.  */
  yytoken = yychar == YYEMPTY ? YYSYMBOL_YYEMPTY : YYTRANSLATE (yychar);
  /* If not already recovering from an error, report this error.  */
  if (!yyerrstatus)
    {
      ++yynerrs;
      yyerror (YY_("syntax error"));
    }

  if (yyerrstatus == 3)
    {
      /* If just tried and failed to reuse lookahead token after an
         error, discard it.  */

      if (yychar <= YYEOF)
        {
          /* Return failure if at end of input.  */
          if (yychar == YYEOF)
            YYABORT;
        }
      else
        {
          yydestruct ("Error: discarding",
                      yytoken, &yylval);
          yychar = YYEMPTY;
        }
    }

  /* Else will try to reuse lookahead token after shifting the error
     token.  */
  goto yyerrlab1;


/*---------------------------------------------------.
| yyerrorlab -- error raised explicitly by YYERROR.  |
`---------------------------------------------------*/
yyerrorlab:
  /* Pacify compilers when the user code never invokes YYERROR and the
     label yyerrorlab therefore never appears in user code.  */
  if (0)
    YYERROR;
  ++yynerrs;

  /* Do not reclaim the symbols of the rule whose action triggered
     this YYERROR.  */
  YYPOPSTACK (yylen);
  yylen = 0;
  YY_STACK_PRINT (yyss, yyssp);
  yystate = *yyssp;
  goto yyerrlab1;


/*-------------------------------------------------------------.
| yyerrlab1 -- common code for both syntax error and YYERROR.  |
`-------------------------------------------------------------*/
yyerrlab1:
  yyerrstatus = 3;      /* Each real token shifted decrements this.  */

  /* Pop stack until we find a state that shifts the error token.  */
  for (;;)
    {
      yyn = yypact[yystate];
      if (!yypact_value_is_default (yyn))
        {
          yyn += YYSYMBOL_YYerror;
          if (0 <= yyn && yyn <= YYLAST && yycheck[yyn] == YYSYMBOL_YYerror)
            {
              yyn = yytable[yyn];
              if (0 < yyn)
                break;
            }
        }

      /* Pop the current state because it cannot handle the error token.  */
      if (yyssp == yyss)
        YYABORT;


      yydestruct ("Error: popping",
                  YY_ACCESSING_SYMBOL (yystate), yyvsp);
      YYPOPSTACK (1);
      yystate = *yyssp;
      YY_STACK_PRINT (yyss, yyssp);
    }

  YY_IGNORE_MAYBE_UNINITIALIZED_BEGIN
  *++yyvsp = yylval;
  YY_IGNORE_MAYBE_UNINITIALIZED_END


  /* Shift the error token.  */
  YY_SYMBOL_PRINT ("Shifting", YY_ACCESSING_SYMBOL (yyn), yyvsp, yylsp);

  yystate = yyn;
  goto yynewstate;


/*-------------------------------------.
| yyacceptlab -- YYACCEPT comes here.  |
`-------------------------------------*/
yyacceptlab:
  yyresult = 0;
  goto yyreturnlab;


/*-----------------------------------.
| yyabortlab -- YYABORT comes here.  |
`-----------------------------------*/
yyabortlab:
  yyresult = 1;
  goto yyreturnlab;


/*-----------------------------------------------------------.
| yyexhaustedlab -- YYNOMEM (memory exhaustion) comes here.  |
`-----------------------------------------------------------*/
yyexhaustedlab:
  yyerror (YY_("memory exhausted"));
  yyresult = 2;
  goto yyreturnlab;


/*----------------------------------------------------------.
| yyreturnlab -- parsing is finished, clean up and return.  |
`----------------------------------------------------------*/
yyreturnlab:
  if (yychar != YYEMPTY)
    {
      /* Make sure we have latest lookahead translation.  See comments at
         user semantic actions for why this is necessary.  */
      yytoken = YYTRANSLATE (yychar);
      yydestruct ("Cleanup: discarding lookahead",
                  yytoken, &yylval);
    }
  /* Do not reclaim the symbols of the rule whose action triggered
     this YYABORT or YYACCEPT.  */
  YYPOPSTACK (yylen);
  YY_STACK_PRINT (yyss, yyssp);
  while (yyssp != yyss)
    {
      yydestruct ("Cleanup: popping",
                  YY_ACCESSING_SYMBOL (+*yyssp), yyvsp);
      YYPOPSTACK (1);
    }
#ifndef yyoverflow
  if (yyss != yyssa)
    YYSTACK_FREE (yyss);
#endif

  return yyresult;
}